

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O1

int scep_conf_load_operation_enroll(CONF *conf)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","PrivateKeyFile");
  if ((pcVar2 != (char *)0x0) && (k_flag == 0)) {
    k_flag = 1;
    k_char = strdup(pcVar2);
    if (k_char == (char *)0x0) goto LAB_00107fe2;
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","CertReqFile");
  if ((pcVar2 != (char *)0x0) && (r_flag == 0)) {
    r_flag = 1;
    r_char = strdup(pcVar2);
    if (r_char == (char *)0x0) goto LAB_00107fe2;
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","SignKeyFile");
  if ((pcVar2 != (char *)0x0) && (K_flag == 0)) {
    K_flag = 1;
    K_char = strdup(pcVar2);
    if (K_char == (char *)0x0) goto LAB_00107fe2;
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","SignCertFile");
  if ((pcVar2 != (char *)0x0) && (O_flag == 0)) {
    O_flag = 1;
    O_char = strdup(pcVar2);
    if (O_char == (char *)0x0) goto LAB_00107fe2;
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","LocalCertFile");
  if ((pcVar2 != (char *)0x0) && (l_flag == 0)) {
    l_flag = 1;
    l_char = strdup(pcVar2);
    if (l_char == (char *)0x0) goto LAB_00107fe2;
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","EncCertFile");
  if ((pcVar2 != (char *)0x0) && (e_flag == 0)) {
    e_flag = 1;
    e_char = strdup(pcVar2);
    if (e_char == (char *)0x0) goto LAB_00107fe2;
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","SelfSignedFile");
  if ((pcVar2 != (char *)0x0) && (L_flag == 0)) {
    L_flag = 1;
    L_char = strdup(pcVar2);
    if (L_char == (char *)0x0) {
LAB_00107fe2:
      error_memory();
    }
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","PollInterval");
  if ((pcVar2 != (char *)0x0) && (t_flag == 0)) {
    t_flag = 1;
    t_num = atoi(pcVar2);
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","MaxPollTime");
  if ((pcVar2 != (char *)0x0) && (T_flag == 0)) {
    T_flag = 1;
    T_num = atoi(pcVar2);
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","MaxPollCount");
  if ((pcVar2 != (char *)0x0) && (n_flag == 0)) {
    n_flag = 1;
    n_num = atoi(pcVar2);
  }
  pcVar2 = NCONF_get_string((CONF *)conf,"sscep_enroll","Resume");
  if ((pcVar2 != (char *)0x0) && (R_flag == 0)) {
    iVar1 = strncmp(pcVar2,"true",3);
    if (iVar1 == 0) {
      R_flag = 1;
    }
  }
  return 0;
}

Assistant:

int scep_conf_load_operation_enroll(CONF *conf) {
    char *var;

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_PRIVATEKEYFILE)) && !k_flag) {
        k_flag = 1;
        if(!(k_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_CERTREQFILE)) && !r_flag) {
        r_flag = 1;
        if(!(r_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_SIGNKEYFILE)) && !K_flag) {
        K_flag = 1;
        if(!(K_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_SIGNCERTFILE)) && !O_flag) {
        O_flag = 1;
        if(!(O_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_LOCALCERTFILE)) && !l_flag) {
        l_flag = 1;
        if(!(l_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_ENCCERTFILE)) && !e_flag) {
        e_flag = 1;
        if(!(e_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_SELFSIGNEDFILE)) && !L_flag) {
        L_flag = 1;
        if(!(L_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_POLLINTERVAL)) && !t_flag) {
        t_flag = 1;
        t_num = atoi(var);
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_MAXPOLLTIME)) && !T_flag) {
        T_flag = 1;
        T_num = atoi(var);
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_MAXPOLLCOUNT)) && !n_flag) {
        n_flag = 1;
        n_num = atoi(var);
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_ENROLL, SCEP_CONFIGURATION_PARAM_RESUME)) && !R_flag) {
        if(!strncmp(var, "true", 3) && !R_flag)
            R_flag = 1;
    }
    return 0;
}